

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::setPage(QWizard *this,int theid,QWizardPage *page)

{
  bool bVar1;
  int iVar2;
  QWizardPrivate *pQVar3;
  QWizardPagePrivate *pQVar4;
  iterator iVar5;
  uint *puVar6;
  char *in_RDX;
  uint in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool pageVBoxLayoutEnabled;
  int n;
  QWizardField *field;
  add_const_t<QList<QWizardField>_> *__range1;
  QList<QWizardField> *pendingFields;
  QWizardPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  char *in_stack_fffffffffffffef8;
  undefined1 enable;
  QVBoxLayout *this_00;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  QWizardField *in_stack_ffffffffffffff28;
  int stretch;
  QWizardPrivate *in_stack_ffffffffffffff30;
  QList<QWizardField> *pQVar7;
  int index;
  QList<QWizardField> *this_01;
  undefined1 local_9c [4];
  Connection local_98;
  QWizardField *local_90;
  const_iterator local_88;
  const_iterator local_80;
  char local_78 [32];
  char local_58 [32];
  char local_38 [32];
  char *local_18;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RDX;
  local_c = in_ESI;
  pQVar3 = d_func((QWizard *)0x7ba54f);
  if (local_18 == (char *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               (char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8
              );
    QMessageLogger::warning(local_38,"QWizard::setPage: Cannot insert null page");
  }
  else if (local_c == 0xffffffff) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               (char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8
              );
    QMessageLogger::warning(local_58,"QWizard::setPage: Cannot insert page with ID -1");
  }
  else {
    bVar1 = QMap<int,_QWizardPage_*>::contains
                      ((QMap<int,_QWizardPage_*> *)
                       CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 (char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                 in_stack_fffffffffffffef8);
      QMessageLogger::warning
                (local_78,"QWizard::setPage: Page with duplicate ID %d ignored",(ulong)local_c);
    }
    else {
      QWidget::setParent((QWidget *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_RDI);
      pQVar4 = QWizardPage::d_func((QWizardPage *)0x7ba673);
      pQVar7 = &pQVar4->pendingFields;
      local_80.i = (QWizardField *)&DAT_aaaaaaaaaaaaaaaa;
      this_01 = pQVar7;
      local_80 = QList<QWizardField>::begin
                           ((QList<QWizardField> *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      local_88.i = (QWizardField *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = QList<QWizardField>::end
                           ((QList<QWizardField> *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      while( true ) {
        local_90 = local_88.i;
        bVar1 = QList<QWizardField>::const_iterator::operator!=(&local_80,local_88);
        index = (int)((ulong)pQVar7 >> 0x20);
        enable = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
        if (!bVar1) break;
        in_stack_ffffffffffffff30 =
             (QWizardPrivate *)QList<QWizardField>::const_iterator::operator*(&local_80);
        QWizardPrivate::addField(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        QList<QWizardField>::const_iterator::operator++(&local_80);
      }
      QList<QWizardField>::clear
                ((QList<QWizardField> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      QObject::connect((QObject *)&local_98,local_18,(QObject *)"2completeChanged()",(char *)in_RDI,
                       0xb33873);
      QMetaObject::Connection::~Connection(&local_98);
      iVar5 = QMap<int,_QWizardPage_*>::insert
                        ((QMap<int,_QWizardPage_*> *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff08,
                         (QWizardPage **)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      stretch = iVar5.i._M_node._4_4_;
      pQVar4 = QWizardPage::d_func((QWizardPage *)0x7ba7ac);
      pQVar4->wizard = (QWizard *)in_RDI;
      iVar2 = (**(code **)(*(long *)&(pQVar3->pageVBoxLayout->super_QBoxLayout).super_QLayout + 200)
              )();
      QLayout::isEnabled((QLayout *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      QLayout::setEnabled((QLayout *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          (bool)enable);
      this_00 = pQVar3->pageVBoxLayout;
      iVar2 = iVar2 + -1;
      memset(local_9c,0,4);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7ba83e);
      QBoxLayout::insertWidget
                ((QBoxLayout *)this_01,index,(QWidget *)in_stack_ffffffffffffff30,stretch,
                 (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)pQVar3 >> 0x20,0));
      QWidget::hide((QWidget *)0x7ba864);
      QLayout::setEnabled((QLayout *)CONCAT44(iVar2,in_stack_ffffffffffffff00),
                          SUB81((ulong)this_00 >> 0x38,0));
      bVar1 = false;
      if ((pQVar3->startSetByUser & 1U) == 0) {
        QMap<int,_QWizardPage_*>::constBegin((QMap<int,_QWizardPage_*> *)this_00);
        puVar6 = (uint *)QMap<int,_QWizardPage_*>::const_iterator::key((const_iterator *)0x7ba8b2);
        bVar1 = *puVar6 == local_c;
      }
      if (bVar1) {
        pQVar3->start = local_c;
      }
      pageAdded((QWizard *)0x7ba8ef,(int)((ulong)this_00 >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::setPage(int theid, QWizardPage *page)
{
    Q_D(QWizard);

    if (Q_UNLIKELY(!page)) {
        qWarning("QWizard::setPage: Cannot insert null page");
        return;
    }

    if (Q_UNLIKELY(theid == -1)) {
        qWarning("QWizard::setPage: Cannot insert page with ID -1");
        return;
    }

    if (Q_UNLIKELY(d->pageMap.contains(theid))) {
        qWarning("QWizard::setPage: Page with duplicate ID %d ignored", theid);
        return;
    }

    page->setParent(d->pageFrame);

    QList<QWizardField> &pendingFields = page->d_func()->pendingFields;
    for (const auto &field : std::as_const(pendingFields))
        d->addField(field);
    pendingFields.clear();

    connect(page, SIGNAL(completeChanged()), this, SLOT(_q_updateButtonStates()));

    d->pageMap.insert(theid, page);
    page->d_func()->wizard = this;

    int n = d->pageVBoxLayout->count();

    // disable layout to prevent layout updates while adding
    bool pageVBoxLayoutEnabled = d->pageVBoxLayout->isEnabled();
    d->pageVBoxLayout->setEnabled(false);

    d->pageVBoxLayout->insertWidget(n - 1, page);

    // hide new page and reset layout to old status
    page->hide();
    d->pageVBoxLayout->setEnabled(pageVBoxLayoutEnabled);

    if (!d->startSetByUser && d->pageMap.constBegin().key() == theid)
        d->start = theid;
    emit pageAdded(theid);
}